

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmaturePopulate.cpp
# Opt level: O1

void Assimp::ArmaturePopulate::BuildBoneStack
               (aiNode *current_node,aiNode *root_node,aiScene *scene,
               vector<aiBone_*,_std::allocator<aiBone_*>_> *bones,
               map<aiBone_*,_aiNode_*,_std::less<aiBone_*>,_std::allocator<std::pair<aiBone_*const,_aiNode_*>_>_>
               *bone_stack,vector<aiNode_*,_std::allocator<aiNode_*>_> *node_stack)

{
  aiBone *node_name;
  pointer ppaVar1;
  aiNode *paVar2;
  Logger *pLVar3;
  ostream *this;
  pointer ppaVar4;
  char *local_1f8;
  long *local_1f0;
  long local_1e0 [2];
  aiNode *local_1d0;
  vector<aiNode_*,_std::allocator<aiNode_*>_> *local_1c8;
  _Rb_tree<aiBone*,std::pair<aiBone*const,aiNode*>,std::_Select1st<std::pair<aiBone*const,aiNode*>>,std::less<aiBone*>,std::allocator<std::pair<aiBone*const,aiNode*>>>
  *local_1c0;
  pointer local_1b8;
  char *local_1b0;
  pair<aiBone_*,_aiNode_*> local_1a8 [7];
  ios_base local_138 [264];
  
  local_1c0 = (_Rb_tree<aiBone*,std::pair<aiBone*const,aiNode*>,std::_Select1st<std::pair<aiBone*const,aiNode*>>,std::less<aiBone*>,std::allocator<std::pair<aiBone*const,aiNode*>>>
               *)bone_stack;
  if (scene == (aiScene *)0x0) {
    __assert_fail("scene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                  ,0xa9,
                  "static void Assimp::ArmaturePopulate::BuildBoneStack(aiNode *, const aiNode *, const aiScene *, const std::vector<aiBone *> &, std::map<aiBone *, aiNode *> &, std::vector<aiNode *> &)"
                 );
  }
  if (root_node == (aiNode *)0x0) {
    __assert_fail("root_node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                  ,0xaa,
                  "static void Assimp::ArmaturePopulate::BuildBoneStack(aiNode *, const aiNode *, const aiScene *, const std::vector<aiBone *> &, std::map<aiBone *, aiNode *> &, std::vector<aiNode *> &)"
                 );
  }
  local_1d0 = root_node;
  if ((node_stack->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (node_stack->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    __assert_fail("!node_stack.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                  ,0xab,
                  "static void Assimp::ArmaturePopulate::BuildBoneStack(aiNode *, const aiNode *, const aiScene *, const std::vector<aiBone *> &, std::map<aiBone *, aiNode *> &, std::vector<aiNode *> &)"
                 );
  }
  ppaVar4 = (bones->super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_1b8 = (bones->super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  if (ppaVar4 != local_1b8) {
    local_1c8 = node_stack;
    do {
      node_name = *ppaVar4;
      if (node_name == (aiBone *)0x0) {
        __assert_fail("bone",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                      ,0xae,
                      "static void Assimp::ArmaturePopulate::BuildBoneStack(aiNode *, const aiNode *, const aiScene *, const std::vector<aiBone *> &, std::map<aiBone *, aiNode *> &, std::vector<aiNode *> &)"
                     );
      }
      paVar2 = GetNodeFromStack(&node_name->mName,node_stack);
      if (paVar2 == (aiNode *)0x0) {
        ppaVar1 = (node_stack->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if ((node_stack->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
            super__Vector_impl_data._M_finish != ppaVar1) {
          (node_stack->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
          super__Vector_impl_data._M_finish = ppaVar1;
        }
        BuildNodeList(local_1d0,node_stack);
        pLVar3 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[39]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [39])"Resetting bone stack: nullptr element ");
        local_1f8 = (node_name->mName).data;
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
                   &local_1f8);
        std::__cxx11::stringbuf::str();
        Logger::debug(pLVar3,(char *)local_1f0);
        if (local_1f0 != local_1e0) {
          operator_delete(local_1f0,local_1e0[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        paVar2 = GetNodeFromStack(&node_name->mName,node_stack);
        if (paVar2 != (aiNode *)0x0) goto LAB_003e9aed;
        pLVar3 = DefaultLogger::get();
        Logger::error(pLVar3,"serious import issue node for bone was not detected");
      }
      else {
LAB_003e9aed:
        pLVar3 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[25]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [25])"Successfully added bone[");
        local_1f8 = (node_name->mName).data;
        this = (ostream *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         local_1a8,&local_1f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (this,"] to stack and bone node is: ",0x1d);
        local_1b0 = (paVar2->mName).data;
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)this,
                   &local_1b0);
        std::__cxx11::stringbuf::str();
        Logger::debug(pLVar3,(char *)local_1f0);
        node_stack = local_1c8;
        if (local_1f0 != local_1e0) {
          operator_delete(local_1f0,local_1e0[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        local_1a8[0].first = node_name;
        local_1a8[0].second = paVar2;
        std::
        _Rb_tree<aiBone*,std::pair<aiBone*const,aiNode*>,std::_Select1st<std::pair<aiBone*const,aiNode*>>,std::less<aiBone*>,std::allocator<std::pair<aiBone*const,aiNode*>>>
        ::_M_emplace_unique<std::pair<aiBone*,aiNode*>>(local_1c0,local_1a8);
      }
      ppaVar4 = ppaVar4 + 1;
    } while (ppaVar4 != local_1b8);
  }
  return;
}

Assistant:

void ArmaturePopulate::BuildBoneStack(aiNode *current_node,
                                      const aiNode *root_node,
                                      const aiScene *scene,
                                      const std::vector<aiBone *> &bones,
                                      std::map<aiBone *, aiNode *> &bone_stack,
                                      std::vector<aiNode *> &node_stack) {
  ai_assert(scene);
  ai_assert(root_node);
  ai_assert(!node_stack.empty());

  for (aiBone *bone : bones) {
    ai_assert(bone);
    aiNode *node = GetNodeFromStack(bone->mName, node_stack);
    if (node == nullptr) {
      node_stack.clear();
      BuildNodeList(root_node, node_stack);
      ASSIMP_LOG_DEBUG_F("Resetting bone stack: nullptr element ", bone->mName.C_Str());

      node = GetNodeFromStack(bone->mName, node_stack);

      if (!node) {
        ASSIMP_LOG_ERROR("serious import issue node for bone was not detected");
        continue;
      }
    }

    ASSIMP_LOG_DEBUG_F("Successfully added bone[", bone->mName.C_Str(), "] to stack and bone node is: ", node->mName.C_Str());

    bone_stack.insert(std::pair<aiBone *, aiNode *>(bone, node));
  }
}